

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

bool __thiscall
vera::Scene::addTexture(Scene *this,string *_name,Image *_image,bool _flip,bool _verbose)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  mapped_type *ppTVar4;
  Texture *pTVar5;
  Texture *tex_1;
  Texture *tex;
  _Self local_38;
  byte local_2a;
  undefined1 local_29;
  bool _verbose_local;
  Image *pIStack_28;
  bool _flip_local;
  Image *_image_local;
  string *_name_local;
  Scene *this_local;
  
  local_2a = _verbose;
  local_29 = _flip;
  pIStack_28 = _image;
  _image_local = (Image *)_name;
  _name_local = (string *)this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
       ::find(&this->textures,_name);
  tex = (Texture *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
        ::end(&this->textures);
  bVar1 = std::operator==(&local_38,(_Self *)&tex);
  if (bVar1) {
    pTVar5 = (Texture *)operator_new(0x48);
    Texture::Texture(pTVar5);
    uVar2 = (*pTVar5->_vptr_Texture[2])(pTVar5,pIStack_28,0);
    if ((uVar2 & 1) != 0) {
      ppTVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                ::operator[](&this->textures,(key_type *)_image_local);
      *ppTVar4 = pTVar5;
      if ((local_2a & 1) != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"uniform sampler2D   ");
        poVar3 = std::operator<<(poVar3,(string *)_image_local);
        poVar3 = std::operator<<(poVar3,";");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"uniform vec2        ");
        poVar3 = std::operator<<(poVar3,(string *)_image_local);
        poVar3 = std::operator<<(poVar3,"Resolution;");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      return true;
    }
    if (pTVar5 != (Texture *)0x0) {
      (*pTVar5->_vptr_Texture[1])();
    }
  }
  else {
    ppTVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
              ::operator[](&this->textures,(key_type *)_image_local);
    (*(*ppTVar4)->_vptr_Texture[2])(*ppTVar4,pIStack_28,0);
    pTVar5 = (Texture *)operator_new(0x48);
    Texture::Texture(pTVar5);
  }
  return false;
}

Assistant:

bool Scene::addTexture(const std::string& _name, const Image& _image, bool _flip, bool _verbose) {
    if (textures.find(_name) == textures.end()) {
        Texture* tex = new Texture();

        // TODO:
        //  - flip

        // load an image into the texture
        if (tex->load(_image)) {
            
            // the image is loaded finish add the texture to the uniform list
            textures[_name] = tex;
            
            if (_verbose) {
                std::cout << "uniform sampler2D   " << _name  << ";"<< std::endl;
                std::cout << "uniform vec2        " << _name  << "Resolution;"<< std::endl;
            }

            return true;
        }
        else
            delete tex;
    }
    else {
        // TODO:
        //  - flip
        //  - error handling

        textures[_name]->load(_image);
        Texture* tex = new Texture();
    }
    return false;
}